

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_allocref(ASMState *as,IRRef ref,RegSet allow)

{
  IRIns *pIVar1;
  byte bVar2;
  uint uVar3;
  uint local_30;
  uint local_2c;
  Reg r;
  RegSet pick;
  IRIns *ir;
  RegSet allow_local;
  IRRef ref_local;
  ASMState *as_local;
  
  pIVar1 = as->ir;
  local_2c = as->freeset & allow;
  if (local_2c == 0) {
    local_30 = ra_evict(as,allow);
    goto LAB_00171452;
  }
  if ((&pIVar1->field_1)[ref].r < 0xfd) {
    local_30 = (&pIVar1->field_1)[ref].r & 0x7f;
    if ((local_2c >> ((byte)local_30 & 0x1f) & 1) != 0) goto LAB_00171452;
    if (((allow >> ((byte)local_30 & 0x1f) & 1) != 0) && ((as->cost[local_30] & 0xffff) < 0x8001)) {
      ra_rematk(as,as->cost[local_30] & 0xffff);
      goto LAB_00171452;
    }
  }
  if ((ref < as->loopref) && (((&pIVar1->field_1)[ref].t.irt & 0x40) == 0)) {
    if ((local_2c & (as->modset ^ 0xffffffff)) != 0) {
      local_2c = (as->modset ^ 0xffffffff) & local_2c;
    }
    local_30 = 0;
    for (; (local_2c & 1) == 0; local_2c = local_2c >> 1 | 0x80000000) {
      local_30 = local_30 + 1;
    }
  }
  else {
    if ((local_2c & 0xf038) != 0) {
      local_2c = local_2c & 0xf038;
    }
    uVar3 = local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
            local_2c << 0x18;
    local_30 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> local_30 == 0; local_30 = local_30 - 1) {
      }
    }
    local_30 = local_30 ^ 0x18;
  }
LAB_00171452:
  bVar2 = (byte)local_30;
  (&pIVar1->field_1)[ref].r = bVar2;
  as->freeset = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & as->freeset;
  as->weakset = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & as->weakset;
  as->cost[local_30] = ref * 0x10001 + ((&pIVar1->field_1)[ref].t.irt & 0x40) * 0x10000;
  return local_30;
}

Assistant:

static Reg ra_allocref(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  RegSet pick = as->freeset & allow;
  Reg r;
  lj_assertA(ra_noreg(ir->r),
	     "IR %04d already has reg %d", ref - REF_BIAS, ir->r);
  if (pick) {
    /* First check register hint from propagation or PHI. */
    if (ra_hashint(ir->r)) {
      r = ra_gethint(ir->r);
      if (rset_test(pick, r))  /* Use hint register if possible. */
	goto found;
      /* Rematerialization is cheaper than missing a hint. */
      if (rset_test(allow, r) && emit_canremat(regcost_ref(as->cost[r]))) {
	ra_rematk(as, regcost_ref(as->cost[r]));
	goto found;
      }
      RA_DBGX((as, "hintmiss  $f $r", ref, r));
    }
    /* Invariants should preferably get unmodified registers. */
    if (ref < as->loopref && !irt_isphi(ir->t)) {
      if ((pick & ~as->modset))
	pick &= ~as->modset;
      r = rset_pickbot(pick);  /* Reduce conflicts with inverse allocation. */
    } else {
      /* We've got plenty of regs, so get callee-save regs if possible. */
      if (RID_NUM_GPR > 8 && (pick & ~RSET_SCRATCH))
	pick &= ~RSET_SCRATCH;
      r = rset_picktop(pick);
    }
  } else {
    r = ra_evict(as, allow);
  }
found:
  RA_DBGX((as, "alloc     $f $r", ref, r));
  ir->r = (uint8_t)r;
  rset_clear(as->freeset, r);
  ra_noweak(as, r);
  as->cost[r] = REGCOST_REF_T(ref, irt_t(ir->t));
  return r;
}